

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::~CConnman(CConnman *this)

{
  CConnman *in_RDI;
  long in_FS_OFFSET;
  CConnman *this_00;
  
  this_00 = *(CConnman **)(in_FS_OFFSET + 0x28);
  Interrupt(this_00);
  Stop(in_RDI);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::~list
            ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)in_RDI
            );
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  std::
  queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
  ::~queue((queue<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>_>
            *)in_RDI);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  std::vector<CService,_std::allocator<CService>_>::~vector
            ((vector<CService,_std::allocator<CService>_> *)this_00);
  std::thread::~thread((thread *)in_RDI);
  std::thread::~thread((thread *)in_RDI);
  std::thread::~thread((thread *)in_RDI);
  std::thread::~thread((thread *)in_RDI);
  std::thread::~thread((thread *)in_RDI);
  std::thread::~thread((thread *)in_RDI);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)this_00);
  CThreadInterrupt::~CThreadInterrupt((CThreadInterrupt *)in_RDI);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  std::condition_variable::~condition_variable(&in_RDI->condMsgProc);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)this_00);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)this_00);
  std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
            ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)this_00);
  std::
  map<unsigned_long,_CConnman::CachedAddrResponse,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
  ::~map((map<unsigned_long,_CConnman::CachedAddrResponse,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
          *)in_RDI);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_RDI);
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::~list
            ((list<CNode_*,_std::allocator<CNode_*>_> *)in_RDI);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::~vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)this_00);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::~vector
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)this_00);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::~vector
            ((vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_> *)this_00);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)this_00);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
            ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)this_00);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(&in_RDI->m_total_bytes_sent_mutex);
  if (*(CConnman **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CConnman::~CConnman()
{
    Interrupt();
    Stop();
}